

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

Primer * __thiscall ASDCP::MXF::Primer::InsertTag(Primer *this,MDDEntry *Entry,TagValue *Tag)

{
  iterator iVar1;
  byte_t bVar2;
  TagValue *in_RCX;
  byte_t bVar3;
  key_type local_a0;
  pair<const_ASDCP::UL,_ASDCP::TagValue> local_80;
  LocalTagEntry local_58;
  
  if ((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
       *)Entry[3].name !=
      (_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
       *)0x0) {
    local_a0.super_Identifier<16U>.m_HasValue = true;
    local_a0.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Tag;
    local_a0.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Tag + 4);
    local_a0.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0021d318;
    iVar1 = std::
            _Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
            ::find((_Rb_tree<ASDCP::UL,_std::pair<const_ASDCP::UL,_ASDCP::TagValue>,_std::_Select1st<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>,_std::less<ASDCP::UL>,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::TagValue>_>_>
                    *)Entry[3].name,&local_a0);
    if (iVar1._M_node == (_Base_ptr)(Entry[3].name + 8)) {
      bVar3 = Tag[8].a;
      bVar2 = Tag[8].b;
      if (bVar2 == '\0' && bVar3 == '\0') {
        bVar2 = Entry[4].ul[0];
        Entry[4].ul[0] = bVar2 + 0xff;
        bVar3 = 0xff;
      }
      in_RCX->a = bVar3;
      in_RCX->b = bVar2;
      local_58.super_IArchive._vptr_IArchive = (_func_int **)&PTR__LocalTagEntry_002226f8;
      local_58.UL.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_0021d318;
      local_58.UL.super_Identifier<16U>.m_HasValue = local_a0.super_Identifier<16U>.m_HasValue;
      local_58.UL.super_Identifier<16U>.m_Value[0] = local_a0.super_Identifier<16U>.m_Value[0];
      local_58.UL.super_Identifier<16U>.m_Value[1] = local_a0.super_Identifier<16U>.m_Value[1];
      local_58.UL.super_Identifier<16U>.m_Value[2] = local_a0.super_Identifier<16U>.m_Value[2];
      local_58.UL.super_Identifier<16U>.m_Value[3] = local_a0.super_Identifier<16U>.m_Value[3];
      local_58.UL.super_Identifier<16U>.m_Value[4] = local_a0.super_Identifier<16U>.m_Value[4];
      local_58.UL.super_Identifier<16U>.m_Value[5] = local_a0.super_Identifier<16U>.m_Value[5];
      local_58.UL.super_Identifier<16U>.m_Value[6] = local_a0.super_Identifier<16U>.m_Value[6];
      local_58.UL.super_Identifier<16U>.m_Value[7] = local_a0.super_Identifier<16U>.m_Value[7];
      local_58.UL.super_Identifier<16U>.m_Value[8] = local_a0.super_Identifier<16U>.m_Value[8];
      local_58.UL.super_Identifier<16U>.m_Value[9] = local_a0.super_Identifier<16U>.m_Value[9];
      local_58.UL.super_Identifier<16U>.m_Value[10] = local_a0.super_Identifier<16U>.m_Value[10];
      local_58.UL.super_Identifier<16U>.m_Value[0xb] = local_a0.super_Identifier<16U>.m_Value[0xb];
      local_58.UL.super_Identifier<16U>.m_Value[0xc] = local_a0.super_Identifier<16U>.m_Value[0xc];
      local_58.UL.super_Identifier<16U>.m_Value[0xd] = local_a0.super_Identifier<16U>.m_Value[0xd];
      local_58.UL.super_Identifier<16U>.m_Value[0xe] = local_a0.super_Identifier<16U>.m_Value[0xe];
      local_58.UL.super_Identifier<16U>.m_Value[0xf] = local_a0.super_Identifier<16U>.m_Value[0xf];
      local_58.Tag = *in_RCX;
      std::
      _Rb_tree<ASDCP::MXF::Primer::LocalTagEntry,ASDCP::MXF::Primer::LocalTagEntry,std::_Identity<ASDCP::MXF::Primer::LocalTagEntry>,std::less<ASDCP::MXF::Primer::LocalTagEntry>,std::allocator<ASDCP::MXF::Primer::LocalTagEntry>>
      ::_M_insert_unique<ASDCP::MXF::Primer::LocalTagEntry_const&>
                ((_Rb_tree<ASDCP::MXF::Primer::LocalTagEntry,ASDCP::MXF::Primer::LocalTagEntry,std::_Identity<ASDCP::MXF::Primer::LocalTagEntry>,std::less<ASDCP::MXF::Primer::LocalTagEntry>,std::allocator<ASDCP::MXF::Primer::LocalTagEntry>>
                  *)&Entry[4].tag,&local_58);
      local_80.first.super_Identifier<16U>.m_HasValue = local_58.UL.super_Identifier<16U>.m_HasValue
      ;
      local_80.first.super_Identifier<16U>.m_Value[0] = local_58.UL.super_Identifier<16U>.m_Value[0]
      ;
      local_80.first.super_Identifier<16U>.m_Value[1] = local_58.UL.super_Identifier<16U>.m_Value[1]
      ;
      local_80.first.super_Identifier<16U>.m_Value[2] = local_58.UL.super_Identifier<16U>.m_Value[2]
      ;
      local_80.first.super_Identifier<16U>.m_Value[3] = local_58.UL.super_Identifier<16U>.m_Value[3]
      ;
      local_80.first.super_Identifier<16U>.m_Value[4] = local_58.UL.super_Identifier<16U>.m_Value[4]
      ;
      local_80.first.super_Identifier<16U>.m_Value[5] = local_58.UL.super_Identifier<16U>.m_Value[5]
      ;
      local_80.first.super_Identifier<16U>.m_Value[6] = local_58.UL.super_Identifier<16U>.m_Value[6]
      ;
      local_80.first.super_Identifier<16U>.m_Value[7] = local_58.UL.super_Identifier<16U>.m_Value[7]
      ;
      local_80.first.super_Identifier<16U>.m_Value[8] = local_58.UL.super_Identifier<16U>.m_Value[8]
      ;
      local_80.first.super_Identifier<16U>.m_Value[9] = local_58.UL.super_Identifier<16U>.m_Value[9]
      ;
      local_80.first.super_Identifier<16U>.m_Value[10] =
           local_58.UL.super_Identifier<16U>.m_Value[10];
      local_80.first.super_Identifier<16U>.m_Value[0xb] =
           local_58.UL.super_Identifier<16U>.m_Value[0xb];
      local_80.first.super_Identifier<16U>.m_Value[0xc] =
           local_58.UL.super_Identifier<16U>.m_Value[0xc];
      local_80.first.super_Identifier<16U>.m_Value[0xd] =
           local_58.UL.super_Identifier<16U>.m_Value[0xd];
      local_80.first.super_Identifier<16U>.m_Value[0xe] =
           local_58.UL.super_Identifier<16U>.m_Value[0xe];
      local_80.first.super_Identifier<16U>.m_Value[0xf] =
           local_58.UL.super_Identifier<16U>.m_Value[0xf];
      local_80.first.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_0021d318;
      local_80.second = local_58.Tag;
      std::
      _Rb_tree<ASDCP::UL,std::pair<ASDCP::UL_const,ASDCP::TagValue>,std::_Select1st<std::pair<ASDCP::UL_const,ASDCP::TagValue>>,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,ASDCP::TagValue>>>
      ::_M_insert_unique<std::pair<ASDCP::UL_const,ASDCP::TagValue>>
                ((_Rb_tree<ASDCP::UL,std::pair<ASDCP::UL_const,ASDCP::TagValue>,std::_Select1st<std::pair<ASDCP::UL_const,ASDCP::TagValue>>,std::less<ASDCP::UL>,std::allocator<std::pair<ASDCP::UL_const,ASDCP::TagValue>>>
                  *)Entry[3].name,&local_80);
    }
    else {
      *in_RCX = *(TagValue *)&iVar1._M_node[2]._M_color;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
    return this;
  }
  __assert_fail("m_Lookup",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                0x217,
                "virtual ASDCP::Result_t ASDCP::MXF::Primer::InsertTag(const MDDEntry &, ASDCP::TagValue &)"
               );
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Primer::InsertTag(const MDDEntry& Entry, ASDCP::TagValue& Tag)
{
  assert(m_Lookup);
  UL TestUL(Entry.ul);
  std::map<UL, TagValue>::iterator i = m_Lookup->find(TestUL);

  if ( i == m_Lookup->end() )
    {
      if ( Entry.tag.a == 0 && Entry.tag.b == 0 )
	{
	  Tag.a = 0xff;
	  Tag.b = m_LocalTag--;
	}
      else
	{
	  Tag.a = Entry.tag.a;
	  Tag.b = Entry.tag.b;
	}

      LocalTagEntry TmpEntry;
      TmpEntry.UL = TestUL;
      TmpEntry.Tag = Tag;

      LocalTagEntryBatch.insert(TmpEntry);
      m_Lookup->insert(std::map<UL, TagValue>::value_type(TmpEntry.UL, TmpEntry.Tag));
    }
  else
    {
      Tag = (*i).second;
    }
   
  return RESULT_OK;
}